

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O2

int __thiscall
vkt::FunctionPrograms1<vkt::SpirVAssembly::InstanceContext>::init
          (FunctionPrograms1<vkt::SpirVAssembly::InstanceContext> *this,EVP_PKEY_CTX *ctx)

{
  Function p_Var1;
  int extraout_EAX;
  long in_RDX;
  InstanceContext in_stack_ffffffffffffff08;
  
  p_Var1 = this->m_func;
  SpirVAssembly::InstanceContext::InstanceContext
            ((InstanceContext *)&stack0xffffffffffffff08,(InstanceContext *)(in_RDX + 8));
  (*p_Var1)((SourceCollections *)ctx,in_stack_ffffffffffffff08);
  SpirVAssembly::InstanceContext::~InstanceContext((InstanceContext *)&stack0xffffffffffffff08);
  return extraout_EAX;
}

Assistant:

void			init			(vk::SourceCollections& dst, const typename FunctionInstance1<Arg0>::Args& args) const { m_func(dst, args.arg0); }